

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

RayTracingPipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
::RemoveObject(PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
               *this,IDeviceObject *pObject)

{
  iterator __position;
  
  __position._M_current =
       (this->Objects).
       super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->Objects).
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if ((__position._M_current)->m_pObject == pObject) {
        __position = std::
                     vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
                     ::_M_erase(&this->Objects,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (this->Objects).
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return (RayTracingPipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& RemoveObject(IDeviceObject* pObject)
    {
        for (auto it = Objects.begin(); it != Objects.end();)
        {
            if (it->RawPtr() == pObject)
                it = Objects.erase(it);
            else
                ++it;
        }

        return static_cast<DerivedType&>(*this);
    }